

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb__HeapWrite_BitField(leb_Heap *leb,leb_Node node,uint32_t bitValue)

{
  uint32_t uVar1;
  uint uVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  
  uVar1 = leb->maxDepth;
  uVar5 = node.depth;
  uVar4 = node.id;
  uVar6 = uVar5;
  if (uVar4 != uVar5) {
    uVar6 = uVar1;
  }
  bVar3 = 0;
  if (uVar4 != uVar5) {
    bVar3 = (char)uVar1 - (char)node.depth;
  }
  uVar2 = ((uVar1 - uVar6) + 1) * (uVar4 << (bVar3 & 0x1f)) + (2 << ((byte)uVar6 & 0x1f));
  leb->buffer[uVar2 >> 5] =
       bitValue << ((byte)uVar2 & 0x1f) | leb->buffer[uVar2 >> 5] & ~(1 << (uVar2 & 0x1f));
  return;
}

Assistant:

static void
leb__HeapWrite_BitField(
    leb_Heap *leb,
    const leb_Node node,
    const uint32_t bitValue
) {
    uint32_t bitID = leb__NodeBitID_BitField(leb, node);

    leb__SetBitValue(&leb->buffer[bitID >> 5u], bitID & 31u, bitValue);
}